

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall duckdb_re2::DFA::StateToWorkq(DFA *this,State *s,Workq *q)

{
  int id;
  int i;
  long lVar1;
  
  (q->super_SparseSet).size_ = 0;
  q->nextmark_ = q->n_;
  lVar1 = 0;
  do {
    if (s->ninst_ <= lVar1) {
      return;
    }
    id = s->inst_[lVar1];
    if (id == -1) {
      Workq::mark(q);
    }
    else {
      if (id == -2) {
        return;
      }
      AddToQueue(this,q,id,(uint)(byte)s->flag_);
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void DFA::StateToWorkq(State* s, Workq* q) {
  q->clear();
  for (int i = 0; i < s->ninst_; i++) {
    if (s->inst_[i] == Mark) {
      q->mark();
    } else if (s->inst_[i] == MatchSep) {
      // Nothing after this is an instruction!
      break;
    } else {
      // Explore from the head of the list.
      AddToQueue(q, s->inst_[i], s->flag_ & kFlagEmptyMask);
    }
  }
}